

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool gl4cts::EnhancedLayouts::Utils::checkVarying
               (Program *program,Variable *variable,stringstream *stream,bool is_input)

{
  Interface *pIVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pcVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  string structVariable;
  GLchar buffer [16];
  string local_90;
  Program *local_70;
  uint local_64;
  Variable *local_60;
  pointer local_58;
  pointer local_50;
  char local_48 [24];
  
  bVar6 = Variable::IsBlock(variable);
  if (bVar6) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    lVar8 = (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar8 != 0) {
      lVar8 = (lVar8 >> 4) * 0x6db6db6db6db6db7;
      local_70 = (Program *)&pIVar1->m_name;
      lVar8 = lVar8 + (ulong)(lVar8 == 0);
      bVar6 = true;
      lVar12 = 0;
      do {
        bVar7 = verifyVarying(program,(string *)local_70,
                              (Descriptor *)
                              ((long)&((pIVar1->m_members).
                                       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                      m_expected_component + lVar12),stream,is_input);
        if (!bVar7) {
          bVar6 = false;
        }
        lVar12 = lVar12 + 0x70;
        lVar8 = lVar8 + -1;
      } while (lVar8 != 0);
      return bVar6;
    }
    return true;
  }
  bVar6 = Variable::IsStruct(variable);
  if (!bVar6) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,0x1b3c1e9);
    bVar6 = verifyVarying(program,&local_90,&variable->m_descriptor,stream,is_input);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return bVar6;
    }
    goto LAB_00892c5b;
  }
  pIVar1 = (variable->m_descriptor).field_9.m_interface;
  pDVar2 = (pIVar1->m_members).
           super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar3 = (pIVar1->m_members).
           super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = ((long)pDVar3 - (long)pDVar2 >> 4) * 0x6db6db6db6db6db7;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar4 = (variable->m_descriptor).m_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + (variable->m_descriptor).m_name._M_string_length);
  if ((variable->m_descriptor).m_n_array_elements == 0) {
    if (pDVar3 == pDVar2) goto LAB_00892c49;
    bVar6 = true;
    uVar9 = 0;
    uVar11 = 1;
    do {
      bVar7 = verifyVarying(program,&local_90,
                            (pIVar1->m_members).
                            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar9,stream,is_input);
      if (!bVar7) {
        bVar6 = false;
      }
      bVar7 = uVar11 < uVar10;
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar7);
  }
  else if ((variable->m_descriptor).m_n_array_elements == 0) {
LAB_00892c49:
    bVar6 = true;
  }
  else {
    bVar6 = true;
    local_70 = program;
    local_60 = variable;
    local_58 = pDVar3;
    local_50 = pDVar2;
    uVar5 = 0;
    do {
      local_64 = uVar5;
      sprintf(local_48,"%d");
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::append((char *)&local_90);
      std::__cxx11::string::append((char *)&local_90);
      if (local_58 != local_50) {
        lVar12 = 0;
        lVar8 = uVar10 + (uVar10 == 0);
        do {
          bVar7 = verifyVarying(local_70,&local_90,
                                (Descriptor *)
                                ((long)&((pIVar1->m_members).
                                         super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                        m_expected_component + lVar12),stream,is_input);
          if (!bVar7) {
            bVar6 = false;
          }
          lVar12 = lVar12 + 0x70;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      uVar5 = local_64 + 1;
    } while (local_64 + 1 < (local_60->m_descriptor).m_n_array_elements);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == &local_90.field_2) {
    return bVar6;
  }
LAB_00892c5b:
  operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  return bVar6;
}

Assistant:

bool checkVarying(Program& program, const Variable& variable, std::stringstream& stream, bool is_input)
{
	bool result = true;

	if (variable.IsBlock())
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;
		const size_t	  n_members = interface->m_members.size();

		for (size_t i = 0; i < n_members; ++i)
		{
			const Variable::Descriptor& member = interface->m_members[i];
			bool member_result				   = verifyVarying(program, interface->m_name, member, stream, is_input);

			if (false == member_result)
			{
				result = false;
			}
		}
	}
	/*
	 To query the the location of struct member by glGetProgramResource, we need pass the variable name "gs_fs_output[0].single",
	 but in original implementation, the test pass the name "Data.single", which can't get any valid result.
	 struct Data {
	 dmat2 single;
	 dmat2 array[1];
	 };
	 layout (location = 0) in Data gs_fs_output[1];
	 */
	else if (variable.IsStruct())
	{
		Utils::Interface* interface		 = variable.m_descriptor.m_interface;
		const size_t	  n_members		 = interface->m_members.size();
		std::string		  structVariable = variable.m_descriptor.m_name;
		// If struct variable is an array
		if (0 != variable.m_descriptor.m_n_array_elements)
		{
			for (GLuint i = 0; i < variable.m_descriptor.m_n_array_elements; i++)
			{
				GLchar buffer[16];
				sprintf(buffer, "%d", i);
				structVariable.append("[");
				structVariable.append(buffer);
				structVariable.append("]");
				for (size_t j = 0; j < n_members; ++j)
				{
					const Variable::Descriptor& member = interface->m_members[j];
					bool member_result = verifyVarying(program, structVariable, member, stream, is_input);

					if (false == member_result)
					{
						result = false;
					}
				}
			}
		}
		else
		{
			for (GLuint i = 0; i < n_members; ++i)
			{
				const Variable::Descriptor& member = interface->m_members[i];
				bool member_result				   = verifyVarying(program, structVariable, member, stream, is_input);

				if (false == member_result)
				{
					result = false;
				}
			}
		}
	}
	else
	{
		result = verifyVarying(program, "", variable.m_descriptor, stream, is_input);
	}
	return result;
}